

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::FixVariablePS::execute
          (FixVariablePS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  cpp_dec_float<50U,_int,_void> *pcVar1;
  uint *puVar2;
  uint *puVar3;
  bool bVar4;
  int iVar5;
  int32_t iVar6;
  pointer pnVar7;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar8;
  undefined8 uVar9;
  bool bVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar13;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *pDVar14;
  int iVar15;
  VarStatus VVar16;
  long lVar17;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  fpclass_type fVar19;
  cpp_dec_float<50U,_int,_void> *pcVar20;
  cpp_dec_float<50U,_int,_void> *pcVar21;
  long lVar22;
  cpp_dec_float<50U,_int,_void> local_2a8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_270;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *local_268;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_260;
  cpp_dec_float<50U,_int,_void> local_258;
  uint local_218 [2];
  uint auStack_210 [2];
  uint local_208;
  uint uStack_204;
  uint uStack_200;
  uint uStack_1fc;
  uint local_1f8 [4];
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  uint local_1b8 [2];
  uint auStack_1b0 [2];
  uint local_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  uint local_198 [4];
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  cpp_dec_float<50U,_int,_void> local_158;
  cpp_dec_float<50U,_int,_void> local_120;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  int local_80;
  undefined1 local_7c;
  undefined8 local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  lVar17 = (long)this->m_j;
  if (this->m_correctIdx == true) {
    pnVar7 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar15 = this->m_old_j;
    *(undefined8 *)(pnVar7[iVar15].m_backend.data._M_elems + 8) =
         *(undefined8 *)(pnVar7[lVar17].m_backend.data._M_elems + 8);
    uVar9 = *(undefined8 *)&pnVar7[lVar17].m_backend.data;
    uVar11 = *(undefined8 *)(pnVar7[lVar17].m_backend.data._M_elems + 2);
    puVar3 = pnVar7[lVar17].m_backend.data._M_elems + 4;
    uVar12 = *(undefined8 *)(puVar3 + 2);
    puVar2 = pnVar7[iVar15].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = *(undefined8 *)puVar3;
    *(undefined8 *)(puVar2 + 2) = uVar12;
    *(undefined8 *)&pnVar7[iVar15].m_backend.data = uVar9;
    *(undefined8 *)(pnVar7[iVar15].m_backend.data._M_elems + 2) = uVar11;
    pnVar7[iVar15].m_backend.exp = pnVar7[lVar17].m_backend.exp;
    pnVar7[iVar15].m_backend.neg = pnVar7[lVar17].m_backend.neg;
    iVar6 = pnVar7[lVar17].m_backend.prec_elem;
    pnVar7[iVar15].m_backend.fpclass = pnVar7[lVar17].m_backend.fpclass;
    pnVar7[iVar15].m_backend.prec_elem = iVar6;
    iVar15 = this->m_j;
    pnVar7 = (r->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar5 = this->m_old_j;
    *(undefined8 *)(pnVar7[iVar5].m_backend.data._M_elems + 8) =
         *(undefined8 *)(pnVar7[iVar15].m_backend.data._M_elems + 8);
    uVar9 = *(undefined8 *)&pnVar7[iVar15].m_backend.data;
    uVar11 = *(undefined8 *)(pnVar7[iVar15].m_backend.data._M_elems + 2);
    puVar3 = pnVar7[iVar15].m_backend.data._M_elems + 4;
    uVar12 = *(undefined8 *)(puVar3 + 2);
    puVar2 = pnVar7[iVar5].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = *(undefined8 *)puVar3;
    *(undefined8 *)(puVar2 + 2) = uVar12;
    *(undefined8 *)&pnVar7[iVar5].m_backend.data = uVar9;
    *(undefined8 *)(pnVar7[iVar5].m_backend.data._M_elems + 2) = uVar11;
    pnVar7[iVar5].m_backend.exp = pnVar7[iVar15].m_backend.exp;
    pnVar7[iVar5].m_backend.neg = pnVar7[iVar15].m_backend.neg;
    iVar6 = pnVar7[iVar15].m_backend.prec_elem;
    pnVar7[iVar5].m_backend.fpclass = pnVar7[iVar15].m_backend.fpclass;
    pnVar7[iVar5].m_backend.prec_elem = iVar6;
    lVar17 = (long)this->m_j;
    cStatus->data[this->m_old_j] = cStatus->data[lVar17];
  }
  pnVar7 = (x->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)(pnVar7[lVar17].m_backend.data._M_elems + 8) =
       *(undefined8 *)((this->m_val).m_backend.data._M_elems + 8);
  uVar9 = *(undefined8 *)(this->m_val).m_backend.data._M_elems;
  uVar11 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 2);
  uVar12 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 6);
  puVar3 = pnVar7[lVar17].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar3 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 4);
  *(undefined8 *)(puVar3 + 2) = uVar12;
  *(undefined8 *)&pnVar7[lVar17].m_backend.data = uVar9;
  *(undefined8 *)(pnVar7[lVar17].m_backend.data._M_elems + 2) = uVar11;
  pnVar7[lVar17].m_backend.exp = (this->m_val).m_backend.exp;
  pnVar7[lVar17].m_backend.neg = (this->m_val).m_backend.neg;
  iVar6 = (this->m_val).m_backend.prec_elem;
  pnVar7[lVar17].m_backend.fpclass = (this->m_val).m_backend.fpclass;
  pnVar7[lVar17].m_backend.prec_elem = iVar6;
  local_268 = cStatus;
  local_270 = y;
  if ((this->m_col).
      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .memused < 1) {
    bVar10 = false;
  }
  else {
    lVar17 = 0;
    lVar22 = 0;
    do {
      pNVar8 = (this->m_col).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      pcVar1 = (cpp_dec_float<50U,_int,_void> *)
               ((long)(pNVar8->val).m_backend.data._M_elems + lVar17);
      pcVar20 = &(x->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend;
      local_2a8.fpclass = cpp_dec_float_finite;
      local_2a8.prec_elem = 10;
      local_2a8.data._M_elems[0] = 0;
      local_2a8.data._M_elems[1] = 0;
      local_2a8.data._M_elems[2] = 0;
      local_2a8.data._M_elems[3] = 0;
      local_2a8.data._M_elems[4] = 0;
      local_2a8.data._M_elems[5] = 0;
      local_2a8.data._M_elems._24_5_ = 0;
      local_2a8.data._M_elems[7]._1_3_ = 0;
      local_2a8.data._M_elems._32_5_ = 0;
      local_2a8.data._M_elems[9]._1_3_ = 0;
      local_2a8.exp = 0;
      local_2a8.neg = false;
      pcVar21 = pcVar1;
      if ((&local_2a8 != pcVar20) && (pcVar21 = pcVar20, pcVar1 != &local_2a8)) {
        uVar9 = *(undefined8 *)((pcVar1->data)._M_elems + 8);
        local_2a8.data._M_elems._32_5_ = SUB85(uVar9,0);
        local_2a8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
        local_2a8.data._M_elems._0_8_ = *(undefined8 *)(pcVar1->data)._M_elems;
        local_2a8.data._M_elems._8_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 2);
        local_2a8.data._M_elems._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
        uVar9 = *(undefined8 *)((pcVar1->data)._M_elems + 6);
        local_2a8.data._M_elems._24_5_ = SUB85(uVar9,0);
        local_2a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
        local_2a8.exp = *(int *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar17);
        local_2a8.neg = *(bool *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar17 + 4);
        local_2a8._48_8_ = *(undefined8 *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar17 + 8);
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_2a8,pcVar21)
      ;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&(s->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start
                  [*(int *)((long)(&((this->m_col).
                                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .m_elem)->val + 1) + lVar17)].m_backend,&local_2a8);
      lVar22 = lVar22 + 1;
      iVar15 = (this->m_col).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .memused;
      lVar17 = lVar17 + 0x3c;
    } while (lVar22 < iVar15);
    bVar10 = 0 < iVar15;
  }
  pVVar13 = local_270;
  local_258.data._M_elems._32_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 8);
  local_258.data._M_elems._0_8_ = *(undefined8 *)(this->m_obj).m_backend.data._M_elems;
  local_258.data._M_elems._8_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 2);
  local_258.data._M_elems._16_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 4);
  local_258.data._M_elems._24_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 6);
  local_258.exp = (this->m_obj).m_backend.exp;
  local_258.neg = (this->m_obj).m_backend.neg;
  local_258.fpclass = (this->m_obj).m_backend.fpclass;
  local_258.prec_elem = (this->m_obj).m_backend.prec_elem;
  if (bVar10) {
    lVar17 = 0;
    lVar22 = 0;
    do {
      pNVar8 = (this->m_col).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      pcVar1 = (cpp_dec_float<50U,_int,_void> *)
               ((long)(pNVar8->val).m_backend.data._M_elems + lVar17);
      pcVar20 = &(pVVar13->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start
                 [*(int *)((long)(&pNVar8->val + 1) + lVar17)].m_backend;
      local_2a8.fpclass = cpp_dec_float_finite;
      local_2a8.prec_elem = 10;
      local_2a8.data._M_elems[0] = 0;
      local_2a8.data._M_elems[1] = 0;
      local_2a8.data._M_elems[2] = 0;
      local_2a8.data._M_elems[3] = 0;
      local_2a8.data._M_elems[4] = 0;
      local_2a8.data._M_elems[5] = 0;
      local_2a8.data._M_elems._24_5_ = 0;
      local_2a8.data._M_elems[7]._1_3_ = 0;
      local_2a8.data._M_elems._32_5_ = 0;
      local_2a8.data._M_elems[9]._1_3_ = 0;
      local_2a8.exp = 0;
      local_2a8.neg = false;
      pcVar21 = pcVar1;
      if ((&local_2a8 != pcVar20) && (pcVar21 = pcVar20, pcVar1 != &local_2a8)) {
        uVar9 = *(undefined8 *)((pcVar1->data)._M_elems + 8);
        local_2a8.data._M_elems._32_5_ = SUB85(uVar9,0);
        local_2a8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
        local_2a8.data._M_elems._0_8_ = *(undefined8 *)(pcVar1->data)._M_elems;
        local_2a8.data._M_elems._8_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 2);
        local_2a8.data._M_elems._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
        uVar9 = *(undefined8 *)((pcVar1->data)._M_elems + 6);
        local_2a8.data._M_elems._24_5_ = SUB85(uVar9,0);
        local_2a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
        local_2a8.exp = *(int *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar17);
        local_2a8.neg = *(bool *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar17 + 4);
        local_2a8._48_8_ = *(undefined8 *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar17 + 8);
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_2a8,pcVar21)
      ;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                (&local_258,&local_2a8);
      lVar22 = lVar22 + 1;
      lVar17 = lVar17 + 0x3c;
    } while (lVar22 < (this->m_col).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  iVar15 = this->m_j;
  pnVar18 = (r->val).
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)(pnVar18[iVar15].m_backend.data._M_elems + 8) = local_258.data._M_elems._32_8_;
  puVar3 = pnVar18[iVar15].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar3 = local_258.data._M_elems._16_8_;
  *(undefined8 *)(puVar3 + 2) = local_258.data._M_elems._24_8_;
  *(undefined8 *)pnVar18[iVar15].m_backend.data._M_elems = local_258.data._M_elems._0_8_;
  *(undefined8 *)(pnVar18[iVar15].m_backend.data._M_elems + 2) = local_258.data._M_elems._8_8_;
  pnVar18[iVar15].m_backend.exp = local_258.exp;
  pnVar18[iVar15].m_backend.neg = local_258.neg;
  pnVar18[iVar15].m_backend.fpclass = local_258.fpclass;
  pnVar18[iVar15].m_backend.prec_elem = local_258.prec_elem;
  fVar19 = (this->m_lower).m_backend.fpclass;
  if ((fVar19 != cpp_dec_float_NaN) && ((this->m_upper).m_backend.fpclass != cpp_dec_float_NaN)) {
    iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&(this->m_lower).m_backend,&(this->m_upper).m_backend);
    if (iVar15 == 0) {
      VVar16 = FIXED;
      goto LAB_003027b4;
    }
    fVar19 = (this->m_lower).m_backend.fpclass;
  }
  local_168 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 8);
  local_188 = *(undefined8 *)(this->m_val).m_backend.data._M_elems;
  uStack_180 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 2);
  local_178 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 4);
  uStack_170 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 6);
  iVar15 = (this->m_val).m_backend.exp;
  bVar10 = (this->m_val).m_backend.neg;
  local_198._0_8_ = *(undefined8 *)((this->m_lower).m_backend.data._M_elems + 8);
  local_1b8 = *(uint (*) [2])(this->m_lower).m_backend.data._M_elems;
  auStack_1b0 = *(uint (*) [2])((this->m_lower).m_backend.data._M_elems + 2);
  local_1a8 = (this->m_lower).m_backend.data._M_elems[4];
  uStack_1a4 = (this->m_lower).m_backend.data._M_elems[5];
  uStack_1a0 = (this->m_lower).m_backend.data._M_elems[6];
  uStack_19c = (this->m_lower).m_backend.data._M_elems[7];
  local_270 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT44(local_270._4_4_,(this->m_lower).m_backend.exp);
  bVar4 = (this->m_lower).m_backend.neg;
  iVar6 = (this->m_lower).m_backend.prec_elem;
  uVar9._0_4_ = (this->m_val).m_backend.fpclass;
  uVar9._4_4_ = (this->m_val).m_backend.prec_elem;
  local_260 = &this->m_upper;
  (*(this->super_PostStep)._vptr_PostStep[7])(&local_120,this);
  local_a8 = local_188;
  uStack_a0 = uStack_180;
  local_98 = local_178;
  uStack_90 = uStack_170;
  local_88 = local_168;
  local_e8.m_backend.data._M_elems[5] = uStack_1a4;
  local_e8.m_backend.data._M_elems[4] = local_1a8;
  local_e8.m_backend.data._M_elems[7] = uStack_19c;
  local_e8.m_backend.data._M_elems[6] = uStack_1a0;
  local_e8.m_backend.data._M_elems[0] = local_1b8[0];
  local_e8.m_backend.data._M_elems[1] = local_1b8[1];
  local_e8.m_backend.data._M_elems[2] = auStack_1b0[0];
  local_e8.m_backend.data._M_elems[3] = auStack_1b0[1];
  local_e8.m_backend.data._M_elems[8] = local_198[0];
  local_e8.m_backend.data._M_elems[9] = local_198[1];
  local_e8.m_backend.exp = (int)local_270;
  local_e8.m_backend.prec_elem = iVar6;
  local_e8.m_backend.fpclass = fVar19;
  local_e8.m_backend.neg = bVar4;
  local_80 = iVar15;
  local_7c = bVar10;
  local_78 = uVar9;
  relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
            (&local_68,(soplex *)&local_a8,&local_e8,pnVar18);
  local_2a8.data._M_elems._32_5_ = local_68.m_backend.data._M_elems._32_5_;
  local_2a8.data._M_elems[9]._1_3_ = local_68.m_backend.data._M_elems[9]._1_3_;
  local_2a8.data._M_elems[4] = local_68.m_backend.data._M_elems[4];
  local_2a8.data._M_elems[5] = local_68.m_backend.data._M_elems[5];
  local_2a8.data._M_elems._24_5_ = local_68.m_backend.data._M_elems._24_5_;
  local_2a8.data._M_elems[7]._1_3_ = local_68.m_backend.data._M_elems[7]._1_3_;
  local_2a8.data._M_elems[0] = local_68.m_backend.data._M_elems[0];
  local_2a8.data._M_elems[1] = local_68.m_backend.data._M_elems[1];
  uVar9 = local_2a8.data._M_elems._0_8_;
  local_2a8.data._M_elems[2] = local_68.m_backend.data._M_elems[2];
  local_2a8.data._M_elems[3] = local_68.m_backend.data._M_elems[3];
  local_2a8.exp = local_68.m_backend.exp;
  local_2a8.neg = local_68.m_backend.neg;
  local_2a8.fpclass = local_68.m_backend.fpclass;
  local_2a8.prec_elem = local_68.m_backend.prec_elem;
  if ((local_68.m_backend.neg == true) &&
     (local_2a8.data._M_elems[0] = local_68.m_backend.data._M_elems[0],
     local_2a8.data._M_elems[0] != 0 || local_68.m_backend.fpclass != cpp_dec_float_finite)) {
    local_2a8.neg = false;
  }
  local_2a8.data._M_elems._0_8_ = uVar9;
  if (((local_68.m_backend.fpclass == cpp_dec_float_NaN) || (local_120.fpclass == cpp_dec_float_NaN)
      ) || (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_2a8,&local_120), 0 < iVar15)) {
    local_1c8 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 8);
    local_1e8 = *(undefined8 *)(this->m_val).m_backend.data._M_elems;
    uStack_1e0 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 2);
    local_1d8 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 4);
    uStack_1d0 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 6);
    iVar15 = (this->m_val).m_backend.exp;
    bVar10 = (this->m_val).m_backend.neg;
    local_1f8._0_8_ = *(undefined8 *)((local_260->m_backend).data._M_elems + 8);
    local_218 = *(uint (*) [2])(local_260->m_backend).data._M_elems;
    auStack_210 = *(uint (*) [2])((local_260->m_backend).data._M_elems + 2);
    local_208 = (local_260->m_backend).data._M_elems[4];
    uStack_204 = (local_260->m_backend).data._M_elems[5];
    uStack_200 = (local_260->m_backend).data._M_elems[6];
    uStack_1fc = (local_260->m_backend).data._M_elems[7];
    iVar5 = (this->m_upper).m_backend.exp;
    bVar4 = (this->m_upper).m_backend.neg;
    uVar11._0_4_ = (this->m_val).m_backend.fpclass;
    uVar11._4_4_ = (this->m_val).m_backend.prec_elem;
    uVar12._0_4_ = (this->m_upper).m_backend.fpclass;
    uVar12._4_4_ = (this->m_upper).m_backend.prec_elem;
    pnVar18 = local_260;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_158,this);
    local_a8 = local_1e8;
    uStack_a0 = uStack_1e0;
    local_98 = local_1d8;
    uStack_90 = uStack_1d0;
    local_88 = local_1c8;
    local_e8.m_backend.data._M_elems[5] = uStack_204;
    local_e8.m_backend.data._M_elems[4] = local_208;
    local_e8.m_backend.data._M_elems[7] = uStack_1fc;
    local_e8.m_backend.data._M_elems[6] = uStack_200;
    local_e8.m_backend.data._M_elems[0] = local_218[0];
    local_e8.m_backend.data._M_elems[1] = local_218[1];
    local_e8.m_backend.data._M_elems[2] = auStack_210[0];
    local_e8.m_backend.data._M_elems[3] = auStack_210[1];
    local_e8.m_backend.data._M_elems[8] = local_1f8[0];
    local_e8.m_backend.data._M_elems[9] = local_1f8[1];
    local_e8.m_backend.exp = iVar5;
    local_e8.m_backend.neg = bVar4;
    local_e8.m_backend._48_8_ = uVar12;
    local_80 = iVar15;
    local_7c = bVar10;
    local_78 = uVar11;
    relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
              (&local_68,(soplex *)&local_a8,&local_e8,pnVar18);
    pDVar14 = local_268;
    local_2a8.data._M_elems._32_5_ = local_68.m_backend.data._M_elems._32_5_;
    local_2a8.data._M_elems[9]._1_3_ = local_68.m_backend.data._M_elems[9]._1_3_;
    local_2a8.data._M_elems[4] = local_68.m_backend.data._M_elems[4];
    local_2a8.data._M_elems[5] = local_68.m_backend.data._M_elems[5];
    local_2a8.data._M_elems._24_5_ = local_68.m_backend.data._M_elems._24_5_;
    local_2a8.data._M_elems[7]._1_3_ = local_68.m_backend.data._M_elems[7]._1_3_;
    local_2a8.data._M_elems[0] = local_68.m_backend.data._M_elems[0];
    local_2a8.data._M_elems[1] = local_68.m_backend.data._M_elems[1];
    uVar9 = local_2a8.data._M_elems._0_8_;
    local_2a8.data._M_elems[2] = local_68.m_backend.data._M_elems[2];
    local_2a8.data._M_elems[3] = local_68.m_backend.data._M_elems[3];
    local_2a8.exp = local_68.m_backend.exp;
    local_2a8.neg = local_68.m_backend.neg;
    local_2a8.fpclass = local_68.m_backend.fpclass;
    local_2a8.prec_elem = local_68.m_backend.prec_elem;
    if ((local_68.m_backend.neg == true) &&
       (local_2a8.data._M_elems[0] = local_68.m_backend.data._M_elems[0],
       local_2a8.data._M_elems[0] != 0 || local_68.m_backend.fpclass != cpp_dec_float_finite)) {
      local_2a8.neg = false;
    }
    if ((local_68.m_backend.fpclass == cpp_dec_float_NaN) ||
       (local_158.fpclass == cpp_dec_float_NaN)) {
      VVar16 = ZERO;
      local_268 = pDVar14;
    }
    else {
      local_2a8.data._M_elems._0_8_ = uVar9;
      iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&local_2a8,&local_158);
      VVar16 = (uint)(0 < iVar15) * 3;
      local_268 = pDVar14;
    }
  }
  else {
    VVar16 = ON_LOWER;
  }
LAB_003027b4:
  local_268->data[this->m_j] = VVar16;
  return;
}

Assistant:

void SPxMainSM<R>::FixVariablePS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // update the index mapping; if m_correctIdx is false, we assume that this has happened already
   if(m_correctIdx)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   // primal:
   x[m_j] = m_val;

   for(int k = 0; k < m_col.size(); ++k)
      s[m_col.index(k)] += m_col.value(k) * x[m_j];

   // dual:
   R val = m_obj;

   for(int k = 0; k < m_col.size(); ++k)
      val -= m_col.value(k) * y[m_col.index(k)];

   r[m_j] = val;

   // basis:
   if(m_lower == m_upper)
   {
      assert(EQrel(m_lower, m_val, this->epsilon()));

      cStatus[m_j] = SPxSolverBase<R>::FIXED;
   }
   else
   {
      assert(EQrel(m_val, m_lower, this->epsilon()) || EQrel(m_val, m_upper, this->epsilon())
             || m_val == 0.0);

      cStatus[m_j] = EQrel(m_val, m_lower, this->epsilon()) ? SPxSolverBase<R>::ON_LOWER : (EQrel(m_val,
                     m_upper, this->epsilon()) ? SPxSolverBase<R>::ON_UPPER : SPxSolverBase<R>::ZERO);
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(m_correctIdx)
   {
      if(!this->checkBasisDim(rStatus, cStatus))
      {
         throw SPxInternalCodeException("XMAISM19 Dimension doesn't match after this step.");
      }
   }

#endif
}